

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Izhikevich.cpp
# Opt level: O2

void __thiscall Izhikevich::Izhikevich(Izhikevich *this,long n_populationID,int n_neuronID)

{
  Izhikevich_param *pIVar1;
  Logging *pLVar2;
  
  (this->super_Neuron)._vptr_Neuron = (_func_int **)&PTR_update_00111ae0;
  this->input_current = 0.0;
  this->input_spike = 0.0;
  pIVar1 = (Izhikevich_param *)operator_new(0x28);
  pIVar1->a = 0.02;
  pIVar1->b = 0.2;
  pIVar1->c = -65.0;
  pIVar1->d = 8.0;
  pIVar1->v_thres = 30.0;
  this->param = pIVar1;
  (this->super_Neuron).populationID = n_populationID;
  (this->super_Neuron).neuronID = n_neuronID;
  *(undefined4 *)&this->u = 0;
  *(undefined4 *)((long)&this->u + 4) = 0;
  *(undefined4 *)&this->v = 0;
  *(undefined4 *)((long)&this->v + 4) = 0xc0504000;
  pLVar2 = Logging::getInstance();
  (this->super_Neuron).logger = pLVar2;
  return;
}

Assistant:

Izhikevich::Izhikevich(long n_populationID, int n_neuronID) : param(new Izhikevich_param) {
    populationID = n_populationID;
    neuronID = n_neuronID;
    v = param->c;
    u = 0.0;
    initialize();
}